

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildMultiplyRectAlpha8
               (uchar *table,uchar *pixels,int x,int y,int w,int h,int stride)

{
  uchar *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = pixels + (long)(y * stride) + (long)x;
  uVar3 = (ulong)(uint)w;
  if (w < 1) {
    uVar3 = 0;
  }
  for (; 0 < h; h = h + -1) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      puVar1[uVar2] = table[puVar1[uVar2]];
    }
    puVar1 = puVar1 + stride;
  }
  return;
}

Assistant:

void    ImFontAtlasBuildMultiplyRectAlpha8(const unsigned char table[256], unsigned char* pixels, int x, int y, int w, int h, int stride)
{
    unsigned char* data = pixels + x + y * stride;
    for (int j = h; j > 0; j--, data += stride)
        for (int i = 0; i < w; i++)
            data[i] = table[data[i]];
}